

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

void lha_replace_path_separator(lha *lha,archive_entry *entry)

{
  wchar_t *pwVar1;
  size_t local_58;
  size_t local_40;
  ulong local_28;
  size_t i;
  wchar_t *wp;
  archive_entry *entry_local;
  lha *lha_local;
  
  pwVar1 = archive_entry_pathname_w(entry);
  if (pwVar1 != (wchar_t *)0x0) {
    (lha->ws).length = 0;
    if (pwVar1 == (wchar_t *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = wcslen(pwVar1);
    }
    archive_wstrncat(&lha->ws,pwVar1,local_40);
    for (local_28 = 0; local_28 < (lha->ws).length; local_28 = local_28 + 1) {
      if ((lha->ws).s[local_28] == L'\\') {
        (lha->ws).s[local_28] = L'/';
      }
    }
    archive_entry_copy_pathname_w(entry,(lha->ws).s);
  }
  pwVar1 = archive_entry_symlink_w(entry);
  if (pwVar1 != (wchar_t *)0x0) {
    (lha->ws).length = 0;
    if (pwVar1 == (wchar_t *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = wcslen(pwVar1);
    }
    archive_wstrncat(&lha->ws,pwVar1,local_58);
    for (local_28 = 0; local_28 < (lha->ws).length; local_28 = local_28 + 1) {
      if ((lha->ws).s[local_28] == L'\\') {
        (lha->ws).s[local_28] = L'/';
      }
    }
    archive_entry_copy_symlink_w(entry,(lha->ws).s);
  }
  return;
}

Assistant:

static void
lha_replace_path_separator(struct lha *lha, struct archive_entry *entry)
{
	const wchar_t *wp;
	size_t i;

	if ((wp = archive_entry_pathname_w(entry)) != NULL) {
		archive_wstrcpy(&(lha->ws), wp);
		for (i = 0; i < archive_strlen(&(lha->ws)); i++) {
			if (lha->ws.s[i] == L'\\')
				lha->ws.s[i] = L'/';
		}
		archive_entry_copy_pathname_w(entry, lha->ws.s);
	}

	if ((wp = archive_entry_symlink_w(entry)) != NULL) {
		archive_wstrcpy(&(lha->ws), wp);
		for (i = 0; i < archive_strlen(&(lha->ws)); i++) {
			if (lha->ws.s[i] == L'\\')
				lha->ws.s[i] = L'/';
		}
		archive_entry_copy_symlink_w(entry, lha->ws.s);
	}
}